

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::DrawIndirectBase::CheckProgram(DrawIndirectBase *this,GLuint program)

{
  GLuint GVar1;
  undefined4 uVar2;
  GLsizei maxCount;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  long lVar6;
  reference local_e68;
  DILogger local_e60;
  allocator_type local_cd9;
  undefined1 local_cd8 [8];
  vector<char,_std::allocator<char>_> log_1;
  reference pvStack_cb8;
  GLint length;
  DILogger local_cb0;
  allocator_type local_b29;
  undefined1 local_b28 [8];
  vector<char,_std::allocator<char>_> log;
  allocator_type local_989;
  undefined1 local_988 [8];
  vector<char,_std::allocator<char>_> source;
  undefined1 local_968 [4];
  GLint length_1;
  DILogger local_7e8;
  DILogger local_668;
  DILogger local_4e8;
  int local_364;
  int local_360;
  GLenum type;
  GLint i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> shaders;
  undefined1 local_338 [4];
  GLint attached_shaders;
  int local_1a4;
  undefined1 local_1a0 [4];
  GLint progStatus;
  DIResult status;
  GLuint program_local;
  DrawIndirectBase *this_local;
  
  status.status_._4_4_ = program;
  DIResult::DIResult((DIResult *)local_1a0);
  glu::CallLogWrapper::glGetProgramiv
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,status.status_._4_4_,
             0x8b82,&local_1a4);
  if (local_1a4 == 0) {
    DIResult::error((DILogger *)local_338,(DIResult *)local_1a0);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)local_338,(char (*) [24])"GL_LINK_STATUS is false");
    DILogger::~DILogger((DILogger *)local_338);
    glu::CallLogWrapper::glGetProgramiv
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,status.status_._4_4_,
               0x8b85,(GLint *)((long)&shaders.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    if (0 < shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_) {
      sVar3 = (size_type)
              shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_;
      std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&type + 3));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,sVar3,
                 (allocator<unsigned_int> *)((long)&type + 3));
      std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&type + 3));
      GVar1 = status.status_._4_4_;
      maxCount = shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,0);
      glu::CallLogWrapper::glGetAttachedShaders
                (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar1,maxCount,
                 (GLsizei *)0x0,pvVar4);
      for (local_360 = 0;
          local_360 <
          shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_; local_360 = local_360 + 1) {
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,
                            (long)local_360);
        glu::CallLogWrapper::glGetShaderiv
                  (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,*pvVar4,0x8b4f,
                   &local_364);
        if (local_364 == 0x8b30) {
          DIResult::error(&local_668,(DIResult *)local_1a0);
          glcts::(anonymous_namespace)::DILogger::operator<<
                    ((DILogger *)&local_668,(char (*) [25])"*** Fragment Shader ***\n");
          DILogger::~DILogger(&local_668);
        }
        else if (local_364 == 0x8b31) {
          DIResult::error(&local_4e8,(DIResult *)local_1a0);
          glcts::(anonymous_namespace)::DILogger::operator<<
                    ((DILogger *)&local_4e8,(char (*) [23])"*** Vertex Shader ***\n");
          DILogger::~DILogger(&local_4e8);
        }
        else if (local_364 == 0x91b9) {
          DIResult::error(&local_7e8,(DIResult *)local_1a0);
          glcts::(anonymous_namespace)::DILogger::operator<<
                    ((DILogger *)&local_7e8,(char (*) [24])"*** Compute Shader ***\n");
          DILogger::~DILogger(&local_7e8);
        }
        else {
          DIResult::error((DILogger *)local_968,(DIResult *)local_1a0);
          glcts::(anonymous_namespace)::DILogger::operator<<
                    ((DILogger *)local_968,(char (*) [24])"*** Unknown Shader ***\n");
          DILogger::~DILogger((DILogger *)local_968);
        }
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,
                            (long)local_360);
        glu::CallLogWrapper::glGetShaderiv
                  (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,*pvVar4,0x8b88,
                   (GLint *)&source.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             field_0x14);
        if (0 < (int)source.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_) {
          sVar3 = (size_type)
                  (int)source.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_;
          std::allocator<char>::allocator();
          std::vector<char,_std::allocator<char>_>::vector
                    ((vector<char,_std::allocator<char>_> *)local_988,sVar3,&local_989);
          std::allocator<char>::~allocator(&local_989);
          pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,
                              (long)local_360);
          uVar2 = source.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_;
          GVar1 = *pvVar4;
          pvVar5 = std::vector<char,_std::allocator<char>_>::operator[]
                             ((vector<char,_std::allocator<char>_> *)local_988,0);
          glu::CallLogWrapper::glGetShaderSource
                    (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar1,uVar2,
                     (GLsizei *)0x0,pvVar5);
          DIResult::error((DILogger *)
                          &log.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                          (DIResult *)local_1a0);
          pvVar5 = std::vector<char,_std::allocator<char>_>::operator[]
                             ((vector<char,_std::allocator<char>_> *)local_988,0);
          glcts::(anonymous_namespace)::DILogger::operator<<
                    ((DILogger *)
                     &log.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,pvVar5)
          ;
          DILogger::~DILogger((DILogger *)
                              &log.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               field_0x10);
          std::vector<char,_std::allocator<char>_>::~vector
                    ((vector<char,_std::allocator<char>_> *)local_988);
        }
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,
                            (long)local_360);
        glu::CallLogWrapper::glGetShaderiv
                  (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,*pvVar4,0x8b84,
                   (GLint *)&source.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             field_0x14);
        if (0 < (int)source.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_) {
          sVar3 = (size_type)
                  (int)source.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_;
          std::allocator<char>::allocator();
          std::vector<char,_std::allocator<char>_>::vector
                    ((vector<char,_std::allocator<char>_> *)local_b28,sVar3,&local_b29);
          std::allocator<char>::~allocator(&local_b29);
          pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,
                              (long)local_360);
          uVar2 = source.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_;
          GVar1 = *pvVar4;
          pvVar5 = std::vector<char,_std::allocator<char>_>::operator[]
                             ((vector<char,_std::allocator<char>_> *)local_b28,0);
          glu::CallLogWrapper::glGetShaderInfoLog
                    (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar1,uVar2,
                     (GLsizei *)0x0,pvVar5);
          DIResult::error(&local_cb0,(DIResult *)local_1a0);
          pvStack_cb8 = std::vector<char,_std::allocator<char>_>::operator[]
                                  ((vector<char,_std::allocator<char>_> *)local_b28,0);
          glcts::(anonymous_namespace)::DILogger::operator<<
                    ((DILogger *)&local_cb0,&stack0xfffffffffffff348);
          DILogger::~DILogger(&local_cb0);
          std::vector<char,_std::allocator<char>_>::~vector
                    ((vector<char,_std::allocator<char>_> *)local_b28);
        }
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
    }
    glu::CallLogWrapper::glGetProgramiv
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,status.status_._4_4_,
               0x8b84,(GLint *)&log_1.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                field_0x14);
    if (0 < (int)log_1.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_) {
      sVar3 = (size_type)(int)log_1.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_;
      std::allocator<char>::allocator();
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)local_cd8,sVar3,&local_cd9);
      std::allocator<char>::~allocator(&local_cd9);
      GVar1 = status.status_._4_4_;
      pvVar5 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)local_cd8,0);
      glu::CallLogWrapper::glGetProgramInfoLog
                (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar1,
                 log_1.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_,(GLsizei *)0x0
                 ,pvVar5);
      DIResult::error(&local_e60,(DIResult *)local_1a0);
      local_e68 = std::vector<char,_std::allocator<char>_>::operator[]
                            ((vector<char,_std::allocator<char>_> *)local_cd8,0);
      glcts::(anonymous_namespace)::DILogger::operator<<((DILogger *)&local_e60,&local_e68);
      DILogger::~DILogger(&local_e60);
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)local_cd8);
    }
  }
  lVar6 = DIResult::code((DIResult *)local_1a0);
  DIResult::~DIResult((DIResult *)local_1a0);
  return (ulong)(lVar6 == 0);
}

Assistant:

long CheckProgram(GLuint program)
	{
		DIResult status;
		GLint	progStatus;
		glGetProgramiv(program, GL_LINK_STATUS, &progStatus);

		if (progStatus == GL_FALSE)
		{

			status.error() << "GL_LINK_STATUS is false";

			GLint attached_shaders;
			glGetProgramiv(program, GL_ATTACHED_SHADERS, &attached_shaders);

			if (attached_shaders > 0)
			{
				std::vector<GLuint> shaders(attached_shaders);
				glGetAttachedShaders(program, attached_shaders, NULL, &shaders[0]);

				for (GLint i = 0; i < attached_shaders; ++i)
				{
					// shader type
					GLenum type;
					glGetShaderiv(shaders[i], GL_SHADER_TYPE, reinterpret_cast<GLint*>(&type));
					switch (type)
					{
					case GL_VERTEX_SHADER:
						status.error() << "*** Vertex Shader ***\n";
						break;
					case GL_FRAGMENT_SHADER:
						status.error() << "*** Fragment Shader ***\n";
						break;
					case GL_COMPUTE_SHADER:
						status.error() << "*** Compute Shader ***\n";
						break;
					default:
						status.error() << "*** Unknown Shader ***\n";
						break;
					}

					// shader source
					GLint length;
					glGetShaderiv(shaders[i], GL_SHADER_SOURCE_LENGTH, &length);
					if (length > 0)
					{
						std::vector<GLchar> source(length);
						glGetShaderSource(shaders[i], length, NULL, &source[0]);
						status.error() << source[0];
					}

					// shader info log
					glGetShaderiv(shaders[i], GL_INFO_LOG_LENGTH, &length);
					if (length > 0)
					{
						std::vector<GLchar> log(length);
						glGetShaderInfoLog(shaders[i], length, NULL, &log[0]);
						status.error() << &log[0];
					}
				}
			}

			// program info log
			GLint length;
			glGetProgramiv(program, GL_INFO_LOG_LENGTH, &length);
			if (length > 0)
			{
				std::vector<GLchar> log(length);
				glGetProgramInfoLog(program, length, NULL, &log[0]);
				status.error() << &log[0];
			}
		}

		return status.code() == NO_ERROR;
	}